

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O1

void __thiscall
DenseHashMapMoveTest_CBeginCEnd_Test::TestBody(DenseHashMapMoveTest_CBeginCEnd_Test *this)

{
  uint uVar1;
  size_type sVar2;
  value_type *pvVar3;
  pointer ppVar4;
  long lVar5;
  pointer ppVar6;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  Message local_a8;
  undefined8 *local_a0;
  string local_98;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_78;
  
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_78.num_deleted = 0;
  local_78.num_elements = 0;
  local_78.num_buckets = 0x20;
  local_78.table = (pointer)0x0;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_78.key_info.delkey = 0;
  local_78.key_info.empty_key = 0;
  local_78.table = (pointer)malloc(0x100);
  memset(local_78.table,0,0x100);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::squash_deleted(&local_78);
  local_78.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = true;
  local_78.key_info.delkey = 0xffffffff;
  local_98._M_dataplus._M_p._0_4_ = 1;
  pvVar3 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_78,(int *)&local_98);
  ppVar6 = local_78.table;
  sVar2 = local_78.num_buckets;
  pvVar3->second = 1;
  ppVar4 = local_78.table;
  if (local_78.num_buckets != 0) {
    lVar5 = local_78.num_buckets * 8;
    do {
      uVar1 = ppVar4->first;
      in_R9 = (char *)(ulong)uVar1;
      if ((local_78.key_info.empty_key != uVar1) &&
         ((char *)local_78.num_deleted == (char *)0x0 || local_78.key_info.delkey != uVar1)) break;
      ppVar4 = ppVar4 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  local_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"1","it->first",(int *)&local_a8,&ppVar4->first);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_a8);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x1d0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)CONCAT44(local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  else {
    if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_98._M_string_length !=
          (undefined8 *)(local_98._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_98._M_string_length);
      }
      operator_delete((void *)local_98._M_string_length);
    }
    do {
      ppVar4 = ppVar4 + 1;
      if (ppVar4 == ppVar6 + sVar2) break;
    } while ((local_78.key_info.empty_key == ppVar4->first) ||
            ((char *)local_78.num_deleted != (char *)0x0 &&
             local_78.key_info.delkey == ppVar4->first));
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,ppVar4 == local_78.table + local_78.num_buckets);
    local_a0 = (undefined8 *)0x0;
    if (ppVar4 == local_78.table + local_78.num_buckets) {
      ppVar4 = local_78.table;
      if (local_78.num_buckets != 0) {
        in_R9 = (char *)(local_78.num_buckets * 8);
        do {
          if ((local_78.key_info.empty_key != ppVar4->first) &&
             ((char *)local_78.num_deleted == (char *)0x0 ||
              local_78.key_info.delkey != ppVar4->first)) break;
          ppVar4 = ppVar4 + 1;
          in_R9 = in_R9 + -8;
        } while (in_R9 != (char *)0x0);
      }
      ppVar6 = local_78.table;
      if (local_78.num_buckets != 0) {
        lVar5 = local_78.num_buckets * 8;
        do {
          in_R9 = (char *)local_78.num_deleted;
          if ((local_78.key_info.empty_key != ppVar6->first) &&
             ((char *)local_78.num_deleted == (char *)0x0 ||
              local_78.key_info.delkey != ppVar6->first)) break;
          ppVar6 = ppVar6 + 1;
          lVar5 = lVar5 + -8;
        } while (lVar5 != 0);
      }
      local_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_a8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,ppVar4 == ppVar6);
      local_a0 = (undefined8 *)0x0;
      if (ppVar4 == ppVar6) {
        local_a8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_a8.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,
                      local_78.table + local_78.num_buckets == local_78.table + local_78.num_buckets
                     );
        local_a0 = (undefined8 *)0x0;
        local_98._M_string_length = (size_type)local_a0;
        if (local_78.table + local_78.num_buckets == local_78.table + local_78.num_buckets)
        goto LAB_00a51b16;
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_98,(internal *)&local_a8,(AssertionResult *)"end == h.cend()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x1d9,(char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                           local_98._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
      }
      else {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_98,(internal *)&local_a8,(AssertionResult *)"begin == h.cbegin()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x1d8,(char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                           local_98._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(internal *)&local_a8,(AssertionResult *)"it == h.cend()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x1d3,(char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         local_98._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_) !=
        &local_98.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_98._M_dataplus._M_p._4_4_,local_98._M_dataplus._M_p._0_4_));
    }
    local_98._M_string_length = (size_type)local_a0;
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
      local_98._M_string_length = (size_type)local_a0;
    }
  }
LAB_00a51b16:
  if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_98._M_string_length !=
        (undefined8 *)(local_98._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_98._M_string_length);
    }
    operator_delete((void *)local_98._M_string_length);
  }
  if (local_78.table != (pointer)0x0) {
    free(local_78.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, CBeginCEnd)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;

    auto it = h.cbegin();
    ASSERT_EQ(1, it->first);

    std::advance(it, 1);
    ASSERT_TRUE(it == h.cend());

    using cit = dense_hash_map<int, int>::const_iterator;
    cit begin = h.begin();
    cit end = h.end();
    ASSERT_TRUE(begin == h.cbegin());
    ASSERT_TRUE(end == h.cend());
}